

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modern-coapp.hpp
# Opt level: O0

pdu * coapp::pdu::from(pdu *__return_storage_ptr__,bytes_t *bytes)

{
  value_type vVar1;
  bool bVar2;
  bool bVar3;
  size_type sVar4;
  invalid_pdu *piVar5;
  byte *pbVar6;
  Code *pCVar7;
  reference pvVar8;
  reference puVar9;
  allocator<char> local_161;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_160;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_158;
  string local_150 [32];
  uchar *local_130;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_128;
  _Base_ptr local_120;
  allocator<unsigned_char> local_111;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_110;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_108;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_100;
  pair<unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> local_e8;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_c8;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_c0;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  option_end;
  anon_class_8_1_3fcf65e9 local_b0;
  anon_class_8_1_3fcf65e9 parse_value;
  uint32_t option_length;
  uint32_t option_delta;
  uint local_98 [2];
  option_number_t option_number;
  allocator<unsigned_char> local_81;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_80;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_78;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_70;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_58;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_50;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> it
  ;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_40;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  token_offset;
  int token_length;
  value_type *header;
  bytes_t *bytes_local;
  pdu *result;
  
  sVar4 = Catch::clara::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(bytes);
  if (sVar4 < 4) {
    piVar5 = (invalid_pdu *)__cxa_allocate_exception(8);
    memset(piVar5,0,8);
    invalid_pdu::invalid_pdu(piVar5);
    __cxa_throw(piVar5,&invalid_pdu::typeinfo,invalid_pdu::~invalid_pdu);
  }
  pdu(__return_storage_ptr__);
  pbVar6 = Catch::clara::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (bytes,0);
  __return_storage_ptr__->_version = (uint8_t)((int)(uint)*pbVar6 >> 6);
  if (__return_storage_ptr__->_version != '\x01') {
    piVar5 = (invalid_pdu *)__cxa_allocate_exception(8);
    *piVar5 = (invalid_pdu)0x0;
    invalid_pdu::invalid_pdu(piVar5);
    __cxa_throw(piVar5,&invalid_pdu::typeinfo,invalid_pdu::~invalid_pdu);
  }
  __return_storage_ptr__->_type = (Type)((int)(*pbVar6 & 0x30) >> 4);
  token_offset._M_current._0_4_ = *pbVar6 & 0xf;
  if (8 < (uint)token_offset._M_current) {
    piVar5 = (invalid_pdu *)__cxa_allocate_exception(8);
    *piVar5 = (invalid_pdu)0x0;
    invalid_pdu::invalid_pdu(piVar5);
    __cxa_throw(piVar5,&invalid_pdu::typeinfo,invalid_pdu::~invalid_pdu);
  }
  pCVar7 = Catch::clara::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (bytes,1);
  __return_storage_ptr__->_code = *pCVar7;
  pvVar8 = Catch::clara::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (bytes,2);
  vVar1 = *pvVar8;
  pvVar8 = Catch::clara::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (bytes,3);
  __return_storage_ptr__->_message_id = CONCAT11(vVar1,*pvVar8);
  it._M_current =
       (uchar *)Catch::clara::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                          (bytes);
  local_40 = __gnu_cxx::
             __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator+(&it,4);
  local_50 = __gnu_cxx::
             __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator+(&local_40,(long)(int)(uint)token_offset._M_current);
  local_58._M_current =
       (uchar *)Catch::clara::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(bytes)
  ;
  bVar2 = __gnu_cxx::operator>(&local_50,&local_58);
  if (!bVar2) {
    local_78._M_current = local_40._M_current;
    local_80._M_current = local_50._M_current;
    Catch::clara::std::allocator<unsigned_char>::allocator(&local_81);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    vector<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_70,local_78,local_80,
               &local_81);
    Catch::clara::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&__return_storage_ptr__->_token,&local_70);
    Catch::clara::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_70);
    Catch::clara::std::allocator<unsigned_char>::~allocator(&local_81);
    _option_number =
         Catch::clara::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(bytes);
    bVar2 = __gnu_cxx::operator>=
                      (&local_50,
                       (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)&option_number);
    if (!bVar2) {
      local_98[0] = 0;
      while( true ) {
        _option_length =
             Catch::clara::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(bytes);
        bVar3 = __gnu_cxx::operator<
                          (&local_50,
                           (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            *)&option_length);
        bVar2 = false;
        if (bVar3) {
          puVar9 = __gnu_cxx::
                   __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   ::operator*(&local_50);
          bVar2 = *puVar9 != 0xff;
        }
        if (!bVar2) break;
        pbVar6 = __gnu_cxx::
                 __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ::operator*(&local_50);
        parse_value.it._4_4_ = (uint)(*pbVar6 >> 4);
        pbVar6 = __gnu_cxx::
                 __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ::operator*(&local_50);
        parse_value.it._0_4_ = *pbVar6 & 0xf;
        local_b0.it = &local_50;
        from::anon_class_8_1_3fcf65e9::operator()(&local_b0,(uint32_t *)((long)&parse_value.it + 4))
        ;
        from::anon_class_8_1_3fcf65e9::operator()(&local_b0,(uint32_t *)&parse_value);
        option_end = __gnu_cxx::
                     __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     ::operator++(&local_50,0);
        local_c0 = __gnu_cxx::
                   __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   ::operator+(&local_50,(ulong)(uint)parse_value.it);
        local_c8._M_current =
             (uchar *)Catch::clara::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                (bytes);
        bVar2 = __gnu_cxx::operator>(&local_c0,&local_c8);
        if (bVar2) {
          piVar5 = (invalid_pdu *)__cxa_allocate_exception(8);
          *piVar5 = (invalid_pdu)0x0;
          invalid_pdu::invalid_pdu(piVar5);
          __cxa_throw(piVar5,&invalid_pdu::typeinfo,invalid_pdu::~invalid_pdu);
        }
        local_98[0] = local_98[0] + parse_value.it._4_4_;
        local_108._M_current = local_50._M_current;
        local_110._M_current = local_c0._M_current;
        Catch::clara::std::allocator<unsigned_char>::allocator(&local_111);
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        vector<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_100,local_108,
                   local_110,&local_111);
        std::make_pair<unsigned_int&,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  (&local_e8,local_98,&local_100);
        local_120 = (_Base_ptr)
                    std::
                    multimap<unsigned_int,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
                    ::
                    emplace<std::pair<unsigned_int,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                              ((multimap<unsigned_int,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
                                *)&__return_storage_ptr__->_options,&local_e8);
        Catch::clara::std::
        pair<unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::~pair
                  (&local_e8);
        Catch::clara::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  (&local_100);
        Catch::clara::std::allocator<unsigned_char>::~allocator(&local_111);
        local_50._M_current = local_c0._M_current;
      }
      local_128._M_current =
           (uchar *)Catch::clara::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                              (bytes);
      bVar2 = __gnu_cxx::operator>=(&local_50,&local_128);
      if (!bVar2) {
        local_130 = (uchar *)__gnu_cxx::
                             __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                             ::operator++(&local_50,0);
        local_158._M_current = local_50._M_current;
        local_160._M_current =
             (uchar *)Catch::clara::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                (bytes);
        std::allocator<char>::allocator();
        std::__cxx11::string::
        string<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                  (local_150,local_158,local_160,&local_161);
        std::__cxx11::string::operator=((string *)&__return_storage_ptr__->_payload,local_150);
        std::__cxx11::string::~string(local_150);
        std::allocator<char>::~allocator(&local_161);
      }
    }
    return __return_storage_ptr__;
  }
  piVar5 = (invalid_pdu *)__cxa_allocate_exception(8);
  *piVar5 = (invalid_pdu)0x0;
  invalid_pdu::invalid_pdu(piVar5);
  __cxa_throw(piVar5,&invalid_pdu::typeinfo,invalid_pdu::~invalid_pdu);
}

Assistant:

static pdu from(bytes_t bytes)
    {
        /*

        PDU contains at least 4 bytes:

        0                   1                   2                   3
        0 1 2 3 4 5 6 7 8 9 0 1 2 3 4 5 6 7 8 9 0 1 2 3 4 5 6 7 8 9 0 1
        +-+-+-+-+-+-+-+-+-+-+-+-+-+-+-+-+-+-+-+-+-+-+-+-+-+-+-+-+-+-+-+-+
        |Ver| T |  TKL  |      Code     |          Message ID           |
        +-+-+-+-+-+-+-+-+-+-+-+-+-+-+-+-+-+-+-+-+-+-+-+-+-+-+-+-+-+-+-+-+

        */
        if (bytes.size() < 4)
            throw invalid_pdu();

        pdu result;

        const auto& header = bytes[0];

        result._version = header >> 6;
        if (result._version != 1)
            throw invalid_pdu();

        result._type = static_cast<Type>((header & 0b00110000) >> 4);
        auto token_length = (header & 0b00001111);
        if (token_length > 8)
            throw invalid_pdu();

        result._code = static_cast<Code>(bytes[1]);
        result._message_id = (bytes[2] << 8) | (bytes[3]);

        // Parse token
        auto token_offset = bytes.begin() + 4;
        auto it = token_offset + token_length;

        if (it > bytes.end())
            throw invalid_pdu();

        result._token = { token_offset, it };

        if (it >= bytes.end())
            return result; // No options or payload

        // Parse options
        // Options and payload are separated by a FF byte
        option_number_t option_number = 0;
        while (it < bytes.end() && (*it) != 0xff) {
            // https://datatracker.ietf.org/doc/html/rfc7252#section-3.1

            uint32_t option_delta = *it >> 4;
            uint32_t option_length = *it & 0b00001111;

            auto parse_value = [&] (uint32_t& val) {
                if (val == 13)
                    val = 13 + *(++it);
                else if (val == 14)
                    val = 269 + ((*(++it) << 8) | (*(++it)));
                else if (val == 15)
                    throw invalid_pdu();
            };

            parse_value(option_delta);
            parse_value(option_length);

            it++;
            auto option_end = it + option_length;
            if (option_end > bytes.end())
                throw invalid_pdu();

            option_number += option_delta;
            result._options.emplace(std::make_pair(
                option_number,
                option_value_t { it, option_end }
            ));

            it = option_end;
        }

        if (it >= bytes.end())
            return result; // No payload

        // Skip the payload separator
        it++;

        // Rest of the PDU is payload
        result._payload = { it, bytes.end() };

        return result;
    }